

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O2

void incdec_verify::PreDecTestUint64(void)

{
  bool expected;
  unsigned_long t;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *pSVar1;
  long lVar2;
  allocator local_51;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  
  for (lVar2 = 0x10; lVar2 != 0x1a8; lVar2 = lVar2 + 0x18) {
    t = *(unsigned_long *)(&UNK_0015ae60 + lVar2);
    si.m_int = t;
    pSVar1 = SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             ::operator--(&si);
    expected = *(bool *)((long)&dec_uint64 + lVar2);
    if ((pSVar1->m_int == *(unsigned_long *)(&UNK_0015ae68 + lVar2)) != expected) {
      std::__cxx11::string::string((string *)&si,"Error in case dec_uint64 throw (1): ",&local_51);
      err_msg<unsigned_long>((string *)&si,t,expected);
      std::__cxx11::string::~string((string *)&si);
    }
  }
  return;
}

Assistant:

void PreDecTestUint64()
{
	size_t i;

	for( i = 0; i < COUNTOF(dec_uint64); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt<std::uint64_t> si(dec_uint64[i].x);
			SafeInt<std::uint64_t> vv = --si;

			if(vv != dec_uint64[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != dec_uint64[i].fExpected )
		{
			err_msg( "Error in case dec_uint64 throw (1): ",
			dec_uint64[i].x,
			dec_uint64[i].fExpected );
		}
	}
}